

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instances.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_519a2::Json2Array<aliyun::DrdsDescribeDrdsInstancesInstanceType>::Json2Array
          (Json2Array<aliyun::DrdsDescribeDrdsInstancesInstanceType> *this,Value *value,
          vector<aliyun::DrdsDescribeDrdsInstancesInstanceType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesInstanceType>_>
          *vec)

{
  uint uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_130 [8];
  DrdsDescribeDrdsInstancesInstanceType val;
  int i;
  vector<aliyun::DrdsDescribeDrdsInstancesInstanceType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesInstanceType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::DrdsDescribeDrdsInstancesInstanceType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.version._4_4_ = 0; uVar1 = val.version._4_4_, AVar3 = Json::Value::size(value),
        uVar1 < AVar3; val.version._4_4_ = val.version._4_4_ + 1) {
      aliyun::DrdsDescribeDrdsInstancesInstanceType::DrdsDescribeDrdsInstancesInstanceType
                ((DrdsDescribeDrdsInstancesInstanceType *)local_130);
      value_00 = Json::Value::operator[](value,val.version._4_4_);
      anon_unknown.dwarf_519a2::Json2Type
                (value_00,(DrdsDescribeDrdsInstancesInstanceType *)local_130);
      std::
      vector<aliyun::DrdsDescribeDrdsInstancesInstanceType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesInstanceType>_>
      ::push_back(vec,(value_type *)local_130);
      aliyun::DrdsDescribeDrdsInstancesInstanceType::~DrdsDescribeDrdsInstancesInstanceType
                ((DrdsDescribeDrdsInstancesInstanceType *)local_130);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }